

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O3

void write_fifo(gba_apu_t *apu,int channel,uint32_t value,uint32_t mask)

{
  ushort uVar1;
  ulong uVar2;
  uint8_t uVar3;
  int iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  
  if (apu->enable_audio == true) {
    if (1 < channel) {
      write_fifo_cold_1();
      if (apu->enable_audio != true) {
        return;
      }
      if (channel < 2) {
        uVar1 = (apu->SOUNDCNT_H).raw;
        if ((uVar1 >> 10 & 1) == channel) {
          uVar2 = apu->fifo[0].read_index;
          if (uVar2 < apu->fifo[0].write_index) {
            apu->fifo[0].read_index = uVar2 + 1;
            uVar3 = apu->fifo[0].buf[(uint)uVar2 & 0x1f];
          }
          else {
            uVar3 = '\0';
          }
          apu->fifo[0].sample = uVar3;
        }
        if ((uVar1 >> 0xe & 1) == channel) {
          uVar2 = apu->fifo[1].read_index;
          if (uVar2 < apu->fifo[1].write_index) {
            apu->fifo[1].read_index = uVar2 + 1;
            uVar3 = apu->fifo[1].buf[(uint)uVar2 & 0x1f];
          }
          else {
            uVar3 = '\0';
          }
          apu->fifo[1].sample = uVar3;
        }
        gba_dma();
        return;
      }
      sound_timer_overflow_cold_1();
      halt_baddata();
    }
    uVar5 = apu->fifo[channel].write_index;
    if ((int)uVar5 - (int)apu->fifo[channel].read_index < 0x1d) {
      iVar4 = 0;
      do {
        uVar6 = uVar5;
        if ((char)(mask >> ((byte)iVar4 & 0x1f)) == -1) {
          uVar6 = uVar5 + 1;
          apu->fifo[channel].write_index = uVar6;
          apu->fifo[channel].buf[(uint)uVar5 & 0x1f] = (uint8_t)(value >> ((byte)iVar4 & 0x1f));
        }
        iVar4 = iVar4 + 8;
        uVar5 = uVar6;
      } while (iVar4 != 0x20);
    }
  }
  return;
}

Assistant:

void write_fifo(gba_apu_t* apu, int channel, word value, word mask) {
#ifdef ENABLE_AUDIO
    if (!apu->enable_audio) {
        return;
    }
    unimplemented(channel > 1, "tried to fill FIFO >1")
    int size = apu->fifo[channel].write_index - apu->fifo[channel].read_index;
    if (size <= 28) {
        for (int b = 0; b < 4; b++) {
            byte sample = (value >> (b * 8)) & 0xFF;
            byte bmask = (mask >> (b * 8)) & 0xFF;
            if (bmask == 0xFF) {
                apu->fifo[channel].buf[(apu->fifo[channel].write_index++) % SOUND_FIFO_SIZE] = sample;
            }
        }
    }
#endif
}